

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

string_view slang::ast::getEnumValueName(Compilation *comp,string_view name,int32_t index)

{
  string_view sVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  const_pointer __src;
  size_type sVar6;
  uint in_ECX;
  char *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  char *mem;
  size_t sz;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  byte *local_48;
  long local_40;
  uint local_34;
  size_t local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  local_34 = in_ECX;
  local_30 = in_RDI;
  local_28[0]._M_len = in_RSI;
  local_28[0]._M_str = in_RDX;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
  if (!bVar3) {
    iVar4 = snprintf((char *)0x0,0,"%d",(ulong)local_34);
    local_40 = (long)iVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    pbVar5 = BumpAllocator::allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,local_30);
    local_48 = pbVar5;
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data(local_28);
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    memcpy(pbVar5,__src,sVar6);
    pbVar5 = local_48;
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    snprintf((char *)(pbVar5 + sVar6),local_40 + 1,"%d",(ulong)local_34);
    lVar2 = local_40;
    pbVar5 = local_48;
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,(char *)pbVar5,lVar2 + sVar6);
    local_28[0]._M_len = local_58._M_len;
    local_28[0]._M_str = local_58._M_str;
  }
  sVar1._M_str = local_28[0]._M_str;
  sVar1._M_len = local_28[0]._M_len;
  return sVar1;
}

Assistant:

static std::string_view getEnumValueName(Compilation& comp, std::string_view name, int32_t index) {
    if (!name.empty()) {
        SLANG_ASSERT(index >= 0);

        size_t sz = (size_t)snprintf(nullptr, 0, "%d", index);
        char* mem = (char*)comp.allocate(sz + name.size() + 1, 1);
        memcpy(mem, name.data(), name.size());
        snprintf(mem + name.size(), sz + 1, "%d", index);

        name = std::string_view(mem, sz + name.size());
    }
    return name;
}